

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

bool __thiscall Map::Occupied(Map *this,uchar x,uchar y,OccupiedTarget target,bool adminghost)

{
  Character *this_00;
  NPC *pNVar1;
  bool bVar2;
  reference ppCVar3;
  reference ppNVar4;
  bool local_7a;
  bool local_79;
  NPC *npc;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<NPC_*,_std::allocator<NPC_*>_> *__range2_1;
  bool ghost;
  Character *character;
  const_iterator __end2;
  const_iterator __begin2;
  list<Character_*,_std::allocator<Character_*>_> *__range2;
  bool adminghost_local;
  OccupiedTarget target_local;
  uchar y_local;
  uchar x_local;
  Map *this_local;
  
  bVar2 = InBounds(this,x,y);
  if (bVar2) {
    if (target != NPCOnly) {
      __end2 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin
                         (&this->characters);
      character = (Character *)
                  std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end
                            (&this->characters);
      while (bVar2 = std::operator!=(&__end2,(_Self *)&character), bVar2) {
        ppCVar3 = std::_List_const_iterator<Character_*>::operator*(&__end2);
        this_00 = *ppCVar3;
        local_79 = false;
        if (adminghost) {
          bVar2 = Character::CanInteractCombat(this_00);
          local_7a = true;
          if (bVar2) {
            local_7a = Character::IsHideNpc(this_00);
          }
          local_79 = local_7a;
        }
        if (((this_00->x == x) && (this_00->y == y)) && (local_79 == false)) {
          return true;
        }
        std::_List_const_iterator<Character_*>::operator++(&__end2);
      }
    }
    if (target != PlayerOnly) {
      __end2_1 = std::vector<NPC_*,_std::allocator<NPC_*>_>::begin(&this->npcs);
      npc = (NPC *)std::vector<NPC_*,_std::allocator<NPC_*>_>::end(&this->npcs);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<NPC_*const_*,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                                 *)&npc), bVar2) {
        ppNVar4 = __gnu_cxx::
                  __normal_iterator<NPC_*const_*,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
                  operator*(&__end2_1);
        pNVar1 = *ppNVar4;
        if ((((pNVar1->alive & 1U) != 0) && (pNVar1->x == x)) && (pNVar1->y == y)) {
          return true;
        }
        __gnu_cxx::__normal_iterator<NPC_*const_*,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
        operator++(&__end2_1);
      }
    }
  }
  return false;
}

Assistant:

bool Map::Occupied(unsigned char x, unsigned char y, Map::OccupiedTarget target, bool adminghost) const
{
	if (!InBounds(x, y))
	{
		return false;
	}

	if (target != Map::NPCOnly)
	{
		UTIL_FOREACH(this->characters, character)
		{
			bool ghost = adminghost && (!character->CanInteractCombat() || character->IsHideNpc());

			if (character->x == x && character->y == y && !ghost)
			{
				return true;
			}
		}
	}

	if (target != Map::PlayerOnly)
	{
		UTIL_FOREACH(this->npcs, npc)
		{
			if (npc->alive && npc->x == x && npc->y == y)
			{
				return true;
			}
		}
	}

	return false;
}